

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O0

void __thiscall TSMuxer::writeOutBuffer(TSMuxer *this)

{
  bool bVar1;
  uchar *local_28;
  uint8_t *newBuf_1;
  uint8_t *newBuf;
  TSMuxer *pTStack_10;
  int toFileLen;
  TSMuxer *this_local;
  
  if (this->m_writeBlockSize <= this->m_outBufLen) {
    newBuf._4_4_ = this->m_writeBlockSize & 0xfffff800;
    pTStack_10 = this;
    bVar1 = MuxerManager::isAsyncMode((this->super_AbstractMuxer).m_owner);
    if (bVar1) {
      newBuf_1 = (uint8_t *)operator_new__((long)(this->m_writeBlockSize + 0x400));
      memcpy(newBuf_1,this->m_outBuf + (int)newBuf._4_4_,
             (long)(int)(this->m_outBufLen - newBuf._4_4_));
      if ((this->m_m2tsMode & 1U) == 0) {
        MuxerManager::asyncWriteBuffer
                  ((this->super_AbstractMuxer).m_owner,&this->super_AbstractMuxer,this->m_outBuf,
                   newBuf._4_4_,this->m_muxFile);
      }
      else if ((this->m_prevM2TSPCROffset < (int)newBuf._4_4_) ||
              (bVar1 = std::
                       vector<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
                       ::empty(&this->m_m2tsDelayBlocks), !bVar1)) {
        std::vector<std::pair<unsigned_char*,int>,std::allocator<std::pair<unsigned_char*,int>>>::
        emplace_back<unsigned_char*&,int&>
                  ((vector<std::pair<unsigned_char*,int>,std::allocator<std::pair<unsigned_char*,int>>>
                    *)&this->m_m2tsDelayBlocks,&this->m_outBuf,(int *)((long)&newBuf + 4));
      }
      else {
        MuxerManager::asyncWriteBuffer
                  ((this->super_AbstractMuxer).m_owner,&this->super_AbstractMuxer,this->m_outBuf,
                   newBuf._4_4_,this->m_muxFile);
        this->m_prevM2TSPCROffset = this->m_prevM2TSPCROffset - newBuf._4_4_;
      }
      this->m_outBuf = newBuf_1;
    }
    else {
      if ((this->m_m2tsMode & 1U) == 0) {
        MuxerManager::syncWriteBuffer
                  ((this->super_AbstractMuxer).m_owner,&this->super_AbstractMuxer,this->m_outBuf,
                   newBuf._4_4_,this->m_muxFile);
      }
      else if ((this->m_prevM2TSPCROffset < (int)newBuf._4_4_) ||
              (bVar1 = std::
                       vector<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
                       ::empty(&this->m_m2tsDelayBlocks), !bVar1)) {
        local_28 = (uchar *)operator_new__((long)(int)newBuf._4_4_);
        memcpy(local_28,this->m_outBuf,(long)(int)newBuf._4_4_);
        std::vector<std::pair<unsigned_char*,int>,std::allocator<std::pair<unsigned_char*,int>>>::
        emplace_back<unsigned_char*&,int&>
                  ((vector<std::pair<unsigned_char*,int>,std::allocator<std::pair<unsigned_char*,int>>>
                    *)&this->m_m2tsDelayBlocks,&local_28,(int *)((long)&newBuf + 4));
      }
      else {
        MuxerManager::syncWriteBuffer
                  ((this->super_AbstractMuxer).m_owner,&this->super_AbstractMuxer,this->m_outBuf,
                   newBuf._4_4_,this->m_muxFile);
        this->m_prevM2TSPCROffset = this->m_prevM2TSPCROffset - newBuf._4_4_;
      }
      memmove(this->m_outBuf,this->m_outBuf + (int)newBuf._4_4_,
              (long)(int)(this->m_outBufLen - newBuf._4_4_));
    }
    this->m_outBufLen = this->m_outBufLen - newBuf._4_4_;
  }
  return;
}

Assistant:

void TSMuxer::writeOutBuffer()
{
    if (m_outBufLen >= m_writeBlockSize)
    {
        int toFileLen = m_writeBlockSize & ~(MuxerManager::PHYSICAL_SECTOR_SIZE - 1);
        if (m_owner->isAsyncMode())
        {
            const auto newBuf = new uint8_t[m_writeBlockSize + 1024];
            memcpy(newBuf, m_outBuf + toFileLen, m_outBufLen - toFileLen);
            if (m_m2tsMode)
            {
                if (m_prevM2TSPCROffset >= toFileLen && m_m2tsDelayBlocks.empty())
                {
                    m_owner->asyncWriteBuffer(this, m_outBuf, toFileLen, m_muxFile);
                    m_prevM2TSPCROffset -= toFileLen;
                }
                else
                    m_m2tsDelayBlocks.emplace_back(m_outBuf, toFileLen);
            }
            else
                m_owner->asyncWriteBuffer(this, m_outBuf, toFileLen, m_muxFile);
            m_outBuf = newBuf;
        }
        else
        {
            if (!m_m2tsMode)
                m_owner->syncWriteBuffer(this, m_outBuf, toFileLen, m_muxFile);
            else
            {
                if (m_prevM2TSPCROffset >= toFileLen && m_m2tsDelayBlocks.empty())
                {
                    m_owner->syncWriteBuffer(this, m_outBuf, toFileLen, m_muxFile);
                    m_prevM2TSPCROffset -= toFileLen;
                }
                else
                {
                    auto newBuf = new uint8_t[toFileLen];
                    memcpy(newBuf, m_outBuf, toFileLen);
                    m_m2tsDelayBlocks.emplace_back(newBuf, toFileLen);
                }
            }
            memmove(m_outBuf, m_outBuf + toFileLen, m_outBufLen - toFileLen);
        }
        m_outBufLen -= toFileLen;
    }
}